

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_forceExtDict(LZ4_stream_t *LZ4_dict,char *source,char *dest,int inputSize)

{
  long *pInLimit;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  BYTE *e;
  long *plVar11;
  char *pcVar12;
  BYTE *src;
  long *plVar13;
  long lVar14;
  long *plVar15;
  char cVar16;
  int iVar17;
  long *__src;
  char *pcVar18;
  LZ4_stream_t_internal *dictPtr;
  int iVar19;
  long lVar20;
  char *local_88;
  
  src = (BYTE *)((ulong)(uint)LZ4_dict->table[0x803] + LZ4_dict->table[0x801]);
  if (source < src) {
    src = (BYTE *)source;
  }
  LZ4_renormDictT((LZ4_stream_t_internal *)LZ4_dict,src);
  iVar17 = 0;
  if ((uint)inputSize < 0x7e000001) {
    __src = (long *)source;
    pcVar12 = dest;
    if (0xc < (uint)inputSize) {
      uVar1 = (uint)LZ4_dict->table[0x803];
      pcVar18 = (char *)LZ4_dict->table[0x801];
      pInLimit = (long *)(source + (long)inputSize + -5);
      uVar2 = (uint)LZ4_dict->table[0x800];
      uVar4 = (ulong)uVar2;
      lVar20 = (long)source - uVar4;
      *(uint *)((long)LZ4_dict->table +
               (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) = uVar2
      ;
      local_88 = dest;
LAB_001696c6:
      uVar9 = 0x40;
      uVar5 = 1;
      lVar14 = *(long *)((long)__src + 1);
      plVar13 = (long *)((long)__src + 1);
      do {
        plVar15 = (long *)(uVar5 + (long)plVar13);
        pcVar12 = local_88;
        if (source + (long)inputSize + -0xc < plVar15) break;
        uVar8 = (ulong)((uint)((ulong)(lVar14 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
        uVar5 = (ulong)*(uint *)((long)LZ4_dict->table + uVar8 * 4);
        lVar14 = *plVar15;
        iVar17 = (int)plVar13;
        iVar19 = (int)lVar20;
        *(int *)((long)LZ4_dict->table + uVar8 * 4) = iVar17 - iVar19;
        if (plVar13 <= (long *)(lVar20 + uVar5 + 0xffff)) {
          pcVar12 = (char *)(lVar20 + uVar5);
          pcVar7 = (char *)0x0;
          if (pcVar12 < source) {
            pcVar7 = pcVar18 + ((ulong)uVar1 - (long)source);
          }
          if (*(int *)(pcVar12 + (long)pcVar7) == (int)*plVar13) goto LAB_00169741;
        }
        uVar5 = uVar9 >> 6;
        uVar9 = (ulong)((int)uVar9 + 1);
        plVar13 = plVar15;
      } while( true );
    }
LAB_001699d1:
    pcVar18 = source + ((long)inputSize - (long)__src);
    if (pcVar18 < (char *)0xf) {
      *pcVar12 = (char)pcVar18 << 4;
    }
    else {
      *pcVar12 = -0x10;
      for (pcVar7 = pcVar18 + -0xf; pcVar12 = pcVar12 + 1, (char *)0xfe < pcVar7;
          pcVar7 = pcVar7 + -0xff) {
        *pcVar12 = -1;
      }
      *pcVar12 = (char)pcVar7;
    }
    memcpy(pcVar12 + 1,__src,(size_t)pcVar18);
    iVar17 = ((int)(pcVar12 + 1) + (int)pcVar18) - (int)dest;
  }
  LZ4_dict->table[0x801] = (longlong)source;
  *(int *)(LZ4_dict->table + 0x803) = inputSize;
  *(int *)(LZ4_dict->table + 0x800) = (int)LZ4_dict->table[0x800] + inputSize;
  return iVar17;
LAB_00169741:
  pcVar10 = source;
  if (pcVar12 < source) {
    pcVar10 = pcVar18;
  }
  cVar16 = (char)plVar13 * '\x10' + (char)__src * -0x10;
  lVar14 = 0;
  while( true ) {
    plVar15 = (long *)((long)plVar13 + lVar14);
    if (((plVar15 < __src || (long)plVar15 - (long)__src == 0) ||
        (source + (long)(pcVar7 + lVar14 + (uVar5 - uVar4)) <= pcVar10)) ||
       (*(char *)((long)plVar13 + lVar14 + -1) !=
        source[(long)(pcVar7 + lVar14 + (uVar5 - uVar4) + -1)])) break;
    lVar14 = lVar14 + -1;
    cVar16 = cVar16 + -0x10;
  }
  if ((uint)((iVar17 - (int)__src) + (int)lVar14) < 0xf) {
    plVar13 = (long *)(local_88 + 1);
    *local_88 = cVar16;
  }
  else {
    *local_88 = -0x10;
    plVar13 = (long *)(local_88 + 2);
    for (iVar17 = (iVar17 - (int)__src) + (int)lVar14 + -0xf; 0xfe < iVar17; iVar17 = iVar17 + -0xff
        ) {
      *(char *)((long)plVar13 + -1) = -1;
      plVar13 = (long *)((long)plVar13 + 1);
    }
    *(char *)((long)plVar13 + -1) = (char)iVar17;
  }
  pcVar6 = source + lVar14 + (uVar5 - uVar4);
  plVar11 = (long *)(((long)plVar15 - (long)__src & 0xffffffffU) + (long)plVar13);
  do {
    *plVar13 = *__src;
    plVar13 = plVar13 + 1;
    __src = __src + 1;
  } while (plVar13 < plVar11);
  while( true ) {
    *(short *)plVar11 = (short)plVar15 - (short)pcVar6;
    if (pcVar10 == pcVar18) {
      plVar13 = (long *)(pcVar18 + ((ulong)uVar1 - (long)(pcVar6 + (long)pcVar7)) + (long)plVar15);
      if (pInLimit < pcVar18 + ((ulong)uVar1 - (long)(pcVar6 + (long)pcVar7)) + (long)plVar15) {
        plVar13 = pInLimit;
      }
      uVar2 = LZ4_count((BYTE *)((long)plVar15 + 4),(BYTE *)(pcVar6 + (long)(pcVar7 + 4)),
                        (BYTE *)plVar13);
      __src = (long *)((long)plVar15 + (ulong)(uVar2 + 4));
      if (__src == plVar13) {
        uVar3 = LZ4_count((BYTE *)plVar13,(BYTE *)source,(BYTE *)pInLimit);
        uVar2 = uVar2 + uVar3;
        __src = (long *)((ulong)uVar3 + (long)plVar13);
      }
    }
    else {
      uVar2 = LZ4_count((BYTE *)((long)plVar15 + 4),(BYTE *)(pcVar6 + 4),(BYTE *)pInLimit);
      __src = (long *)((long)plVar15 + (ulong)(uVar2 + 4));
    }
    pcVar12 = (char *)((long)plVar11 + 2);
    if (uVar2 < 0xf) {
      *local_88 = *local_88 + (char)uVar2;
    }
    else {
      *local_88 = *local_88 + '\x0f';
      for (uVar2 = uVar2 - 0xf; 0x1fd < uVar2; uVar2 = uVar2 - 0x1fe) {
        pcVar12[0] = -1;
        pcVar12[1] = -1;
        pcVar12 = pcVar12 + 2;
      }
      if (0xfe < uVar2) {
        uVar2 = uVar2 - 0xff;
        *pcVar12 = -1;
        pcVar12 = pcVar12 + 1;
      }
      *pcVar12 = (char)uVar2;
      pcVar12 = pcVar12 + 1;
    }
    if (source + (long)inputSize + -0xc < __src) goto LAB_001699d1;
    *(int *)((long)LZ4_dict->table +
            (ulong)((uint)((ulong)(*(long *)((long)__src + -2) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4
            ) = ((int)__src + -2) - iVar19;
    uVar5 = (ulong)((uint)((ulong)(*__src * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
    uVar9 = (ulong)*(uint *)((long)LZ4_dict->table + uVar5 * 4);
    pcVar6 = (char *)(lVar20 + uVar9);
    pcVar10 = source;
    pcVar7 = (char *)0x0;
    if (pcVar6 < source) {
      pcVar10 = pcVar18;
      pcVar7 = pcVar18 + ((ulong)uVar1 - (long)source);
    }
    *(int *)((long)LZ4_dict->table + uVar5 * 4) = (int)__src - iVar19;
    local_88 = pcVar12;
    if (((long *)(lVar20 + uVar9 + 0xffff) < __src) ||
       (*(int *)(pcVar6 + (long)pcVar7) != (int)*__src)) break;
    plVar11 = (long *)(pcVar12 + 1);
    *pcVar12 = '\0';
    plVar15 = __src;
  }
  goto LAB_001696c6;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int inputSize)
{
    LZ4_stream_t_internal* streamPtr = (LZ4_stream_t_internal*)LZ4_dict;
    int result;
    const BYTE* const dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    const BYTE* smallest = dictEnd;
    if (smallest > (const BYTE*) source) smallest = (const BYTE*) source;
    LZ4_renormDictT((LZ4_stream_t_internal*)LZ4_dict, smallest);

    result = LZ4_compress_generic(LZ4_dict, source, dest, inputSize, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)inputSize;
    streamPtr->currentOffset += (U32)inputSize;

    return result;
}